

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall CServer::InitRconPasswordIfUnset(CServer *this)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  char aRandomPassword [7];
  unsigned_short aRandom [3];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_RconPasswordSet == 0) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                   ,0x1cb,1,"need at least 2048 possibilities for 2-character sequences");
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                   ,0x1ce,1,"need an even password length");
    aRandomPassword[6] = '\0';
    secure_random_fill(aRandom,6);
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      uVar1 = aRandom[lVar3];
      *(char *)((long)aRandom + lVar3 * 2 + -7) =
           "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789"[(ushort)((uVar1 & 0xffff07ff) / 0x2e)];
      *(char *)(aRandom + lVar3 + -3) =
           "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789"[(ushort)((uVar1 & 0xffff07ff) % 0x2e)];
    }
    str_copy(this->m_pConfig->m_SvRconPassword,aRandomPassword,0x20);
    this->m_GeneratedRconPassword = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServer::InitRconPasswordIfUnset()
{
	if(m_RconPasswordSet)
	{
		return;
	}

	static const char VALUES[] = "ABCDEFGHKLMNPRSTUVWXYZabcdefghjkmnopqt23456789";
	static const size_t NUM_VALUES = sizeof(VALUES) - 1; // Disregard the '\0'.
	static const size_t PASSWORD_LENGTH = 6;
	dbg_assert(NUM_VALUES * NUM_VALUES >= 2048, "need at least 2048 possibilities for 2-character sequences");
	// With 6 characters, we get a password entropy of log(2048) * 6/2 = 33bit.

	dbg_assert(PASSWORD_LENGTH % 2 == 0, "need an even password length");
	unsigned short aRandom[PASSWORD_LENGTH / 2];
	char aRandomPassword[PASSWORD_LENGTH+1];
	aRandomPassword[PASSWORD_LENGTH] = 0;

	secure_random_fill(aRandom, sizeof(aRandom));
	for(size_t i = 0; i < PASSWORD_LENGTH / 2; i++)
	{
		unsigned short RandomNumber = aRandom[i] % 2048;
		aRandomPassword[2 * i + 0] = VALUES[RandomNumber / NUM_VALUES];
		aRandomPassword[2 * i + 1] = VALUES[RandomNumber % NUM_VALUES];
	}

	str_copy(Config()->m_SvRconPassword, aRandomPassword, sizeof(Config()->m_SvRconPassword));
	m_GeneratedRconPassword = 1;
}